

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greg.c
# Opt level: O3

void yy_1_definition(GREG *G,char *yytext,int yyleng,yythunk *thunk,void *yyxvar)

{
  Node *pNVar1;
  
  pNVar1 = findRule(yytext,1);
  pNVar1 = beginRule(pNVar1);
  pNVar1 = push(pNVar1);
  if ((pNVar1->rule).expression == (Node *)0x0) {
    return;
  }
  fprintf(_stderr,"rule \'%s\' redefined\n",yytext);
  return;
}

Assistant:

YY_ACTION(void) yy_1_definition(GREG *G, char *yytext, int yyleng, yythunk *thunk, YY_XTYPE YY_XVAR)
{
#define s G->val[-1]
  yyprintf((stderr, "do yy_1_definition"));
  yyprintfvTcontext(yytext);
  yyprintf((stderr, "\n  {if (push(beginRule(findRule(yytext,1)))->rule.expression)\n\
\t\t\t\t\t\t\t    fprintf(stderr, \"rule '%%s' redefined\\n\", yytext); }\n"));
  if (push(beginRule(findRule(yytext,1)))->rule.expression)
							    fprintf(stderr, "rule '%s' redefined\n", yytext); ;
#undef s
}